

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableViewPrivate::clearConnections(QTableViewPrivate *this)

{
  bool bVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  Connection *connection_3;
  vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *__range1_3;
  Connection *connection_2;
  iterator __end1_2;
  iterator __begin1_2;
  array<QMetaObject::Connection,_5UL> *__range1_2;
  Connection *connection_1;
  iterator __end1_1;
  iterator __begin1_1;
  array<QMetaObject::Connection,_7UL> *__range1_1;
  Connection *connection;
  iterator __end1;
  iterator __begin1;
  array<QMetaObject::Connection,_4UL> *__range1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>
  *in_stack_ffffffffffffff70;
  Connection *local_70;
  Connection *local_50;
  Connection *local_30;
  __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = std::array<QMetaObject::Connection,_4UL>::begin
                       ((array<QMetaObject::Connection,_4UL> *)0x8b2cae);
  pvVar2 = std::array<QMetaObject::Connection,_4UL>::end
                     ((array<QMetaObject::Connection,_4UL> *)0x8b2cbd);
  for (; local_30 != pvVar2; local_30 = local_30 + 1) {
    QObject::disconnect(local_30);
  }
  local_50 = std::array<QMetaObject::Connection,_7UL>::begin
                       ((array<QMetaObject::Connection,_7UL> *)0x8b2d29);
  pvVar3 = std::array<QMetaObject::Connection,_7UL>::end
                     ((array<QMetaObject::Connection,_7UL> *)0x8b2d38);
  for (; local_50 != pvVar3; local_50 = local_50 + 1) {
    QObject::disconnect(local_50);
  }
  local_70 = std::array<QMetaObject::Connection,_5UL>::begin
                       ((array<QMetaObject::Connection,_5UL> *)0x8b2da4);
  pvVar4 = std::array<QMetaObject::Connection,_5UL>::end
                     ((array<QMetaObject::Connection,_5UL> *)0x8b2db3);
  for (; local_70 != pvVar4; local_70 = local_70 + 1) {
    QObject::disconnect(local_70);
  }
  local_10._M_current = (Connection *)&DAT_aaaaaaaaaaaaaaaa;
  local_10._M_current =
       (Connection *)
       std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::begin
                 (in_stack_ffffffffffffff70);
  std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::end
            (in_stack_ffffffffffffff70);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
                        *)in_stack_ffffffffffffff70,in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffff70 =
         (vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)
         __gnu_cxx::
         __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
         ::operator*(&local_10);
    QObject::disconnect((Connection *)in_stack_ffffffffffffff70);
    __gnu_cxx::
    __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
    ::operator++(&local_10);
  }
  QObject::disconnect((Connection *)(in_RDI + 0xb4));
  QObject::disconnect((Connection *)(in_RDI + 0xb3));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableViewPrivate::clearConnections()
{
    for (const QMetaObject::Connection &connection : modelConnections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : verHeaderConnections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : horHeaderConnections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : dynHorHeaderConnections)
        QObject::disconnect(connection);
    QObject::disconnect(selectionmodelConnection);
#if QT_CONFIG(abstractbutton)
    QObject::disconnect(cornerWidgetConnection);
#endif
}